

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O1

void tcg_opt_gen_movi(TCGContext_conflict9 *s,TCGOp *op,TCGArg dst,TCGArg val)

{
  byte bVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  long lVar4;
  long lVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  ulong uVar8;
  
  puVar2 = *(undefined1 **)(dst + 0x30);
  bVar1 = s->tcg_op_defs[*(byte *)op].flags;
  uVar7 = 0x40;
  if ((bVar1 & 0x10) == 0) {
    uVar7 = 6;
  }
  uVar6 = 0x8a;
  if ((bVar1 & 0x40) == 0) {
    uVar6 = uVar7;
  }
  *(undefined1 *)op = uVar6;
  op->args[0] = dst;
  op->args[1] = val;
  puVar3 = *(undefined1 **)(dst + 0x30);
  lVar4 = *(long *)(puVar3 + 0x10);
  lVar5 = *(long *)(*(long *)(puVar3 + 8) + 0x30);
  *(long *)(*(long *)(lVar4 + 0x30) + 8) = *(long *)(puVar3 + 8);
  *(long *)(lVar5 + 0x10) = lVar4;
  *(TCGArg *)(puVar3 + 0x10) = dst;
  *(TCGArg *)(puVar3 + 8) = dst;
  *puVar3 = 0;
  *(undefined8 *)(puVar3 + 0x20) = 0xffffffffffffffff;
  *puVar2 = 1;
  *(TCGArg *)(puVar2 + 0x18) = val;
  uVar8 = val | 0xffffffff00000000;
  if ((bVar1 & 0x50) != 0) {
    uVar8 = val;
  }
  *(ulong *)(puVar2 + 0x20) = uVar8;
  return;
}

Assistant:

static void tcg_opt_gen_movi(TCGContext *s, TCGOp *op, TCGArg dst, TCGArg val)
{
    const TCGOpDef *def;
    TCGOpcode new_op;
    tcg_target_ulong mask;
    struct tcg_temp_info *di = arg_info(dst);

    def = &s->tcg_op_defs[op->opc];
    if (def->flags & TCG_OPF_VECTOR) {
        new_op = INDEX_op_dupi_vec;
    } else if (def->flags & TCG_OPF_64BIT) {
        new_op = INDEX_op_movi_i64;
    } else {
        new_op = INDEX_op_movi_i32;
    }
    op->opc = new_op;
    /* TCGOP_VECL and TCGOP_VECE remain unchanged.  */
    op->args[0] = dst;
    op->args[1] = val;

    reset_temp(dst);
    di->is_const = true;
    di->val = val;
    mask = val;
    if (TCG_TARGET_REG_BITS > 32 && new_op == INDEX_op_movi_i32) {
        /* High bits of the destination are now garbage.  */
        mask |= ~0xffffffffull;
    }
    di->mask = mask;
}